

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::UnitTest::set_current_test_suite(UnitTest *this,TestSuite *a_current_test_suite)

{
  TestSuite *in_RSI;
  GTestMutexLock *in_RDI;
  MutexLock lock;
  MutexBase *in_stack_ffffffffffffffc8;
  
  internal::GTestMutexLock::GTestMutexLock(in_RDI,in_stack_ffffffffffffffc8);
  internal::UnitTestImpl::set_current_test_suite((UnitTestImpl *)in_RDI[8].mutex_,in_RSI);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x162065);
  return;
}

Assistant:

void UnitTest::set_current_test_suite(TestSuite* a_current_test_suite) {
  internal::MutexLock lock(&mutex_);
  impl_->set_current_test_suite(a_current_test_suite);
}